

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.cpp
# Opt level: O1

void Gyroid(void)

{
  undefined8 in_RDI;
  undefined8 local_28;
  undefined8 uStack_20;
  code *local_18;
  code *local_10;
  
  local_28 = 0;
  uStack_20 = 0;
  local_10 = std::_Function_handler<double_(linalg::vec<double,_3>),_GyroidSDF>::_M_invoke;
  local_18 = std::_Function_handler<double_(linalg::vec<double,_3>),_GyroidSDF>::_M_manager;
  manifold::Manifold::LevelSet(0,0,0,in_RDI,&local_28,1);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,3);
  }
  return;
}

Assistant:

Manifold Gyroid() {
  const double period = kTwoPi;
  return Manifold::LevelSet(GyroidSDF(), {vec3(0.0), vec3(period)}, 0.5);
}